

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

char * fct_clp__optval2(fct_clp_t *clp,char *option,char *default_val)

{
  ulong uVar1;
  fctcl_t *clo;
  int iVar2;
  ulong uVar3;
  
  if (clp == (fct_clp_t *)0x0) {
    __assert_fail("clp != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x6d2
                  ,"const char *fct_clp__optval2(fct_clp_t *, const char *, const char *)");
  }
  uVar1 = (clp->clo_list).used_itm_num;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      if ((clp->clo_list).used_itm_num <= uVar3) {
        __assert_fail("idx < list->used_itm_num",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
      }
      clo = (fctcl_t *)(clp->clo_list).itm_list[uVar3];
      iVar2 = fctcl__is_option(clo,option);
      if (iVar2 != 0) {
        if (clo == (fctcl_t *)0x0) {
          return default_val;
        }
        if (clo->value == (char *)0x0) {
          return default_val;
        }
        return clo->value;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return default_val;
}

Assistant:

static char const*
fct_clp__optval2(fct_clp_t *clp, char const *option, char const *default_val)
{
    fctcl_t const *clo =NULL;
    FCT_ASSERT( clp != NULL );
    FCT_ASSERT( option != NULL );
    clo = fct_clp__get_clo(clp, option);
    if ( clo == NULL || clo->value == NULL)
    {
        return default_val;
    }
    return clo->value;
}